

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O2

void __thiscall
soul::ArrayWithPreallocation<soul::pool_ref<soul::heart::Variable>,_4UL>::freeIfHeapAllocated
          (ArrayWithPreallocation<soul::pool_ref<soul::heart::Variable>,_4UL> *this)

{
  if (4 < this->numAllocated) {
    if (this->items != (pool_ref<soul::heart::Variable> *)0x0) {
      operator_delete__(this->items);
    }
    this->items = (pool_ref<soul::heart::Variable> *)this->space;
    this->numAllocated = 4;
  }
  return;
}

Assistant:

void resetToInternalStorage() noexcept
    {
        items = getPreallocatedSpace();
        numAllocated = preallocatedItems;
    }